

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

hashnode * set_hashnode(hashtable *table,void *label,void *record,_Bool *exist)

{
  hashnode *phVar1;
  hashnode *phVar2;
  _Bool is_find;
  _Bool local_19;
  
  local_19 = false;
  phVar1 = get_hashnode(table,label,&local_19);
  if (exist != (_Bool *)0x0) {
    *exist = local_19;
  }
  if (local_19 == true) {
    phVar2 = phVar1;
    if (record == (void *)0x0) {
      return phVar1;
    }
  }
  else {
    phVar2 = (hashnode *)malloc(0x10);
    phVar1->next = phVar2;
    phVar2->next = (hashnode *)0x0;
  }
  phVar2->record = record;
  return phVar2;
}

Assistant:

hashnode* set_hashnode(hashtable* table,void *label,void*record,
                                bool* exist){
  // #if DEBUG == 1
  // printf("set_node:%d\n",*(int*)label);
  // #endif

  bool is_find =false;
  hashnode* node = get_hashnode(table,label,&is_find);
  if(exist)*exist=is_find;
  if (is_find){
    if(record!=NULL)node->record = record;
  }else{
    node->next = (hashnode *)malloc(sizeof(hashnode));
    node = node->next;
    node->next = NULL;//现在node是最后一个节点
    // node->id = table->hash(label) % table->size;
    //！！！即使record==NULL也会照样赋值。
    node->record = record;
  }
  return node;
}